

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O1

int __thiscall FTextureManager::CountBuildTiles(FTextureManager *this)

{
  int iVar1;
  int iVar2;
  char *copyStr;
  long lVar3;
  FILE *__stream;
  int *piVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ulong __n;
  char artfile [13];
  FString rffpath;
  FString artpath;
  int local_5c;
  char local_58 [16];
  FString local_48;
  FString local_40;
  TArray<unsigned_char_*,_unsigned_char_*> *local_38;
  
  builtin_strncpy(local_58,"tilesXXX.art",0xd);
  local_5c = 0;
  iVar1 = FWadCollection::CheckNumForFullName(&Wads,"blood.pal",false,0);
  uVar7 = 0;
  if (-1 < iVar1) {
    iVar1 = FWadCollection::GetLumpFile(&Wads,iVar1);
    copyStr = FWadCollection::GetWadFullName(&Wads,iVar1);
    FString::FString(&local_48,copyStr);
    lVar3 = FString::LastIndexOf(&local_48,'/');
    if ((int)lVar3 < 0) {
      FString::operator+=(&local_48,'/');
    }
    else {
      FString::Truncate(&local_48,(ulong)((int)lVar3 + 1));
    }
    local_38 = &this->BuildTileFiles;
    uVar7 = 0;
    local_5c = 0;
    do {
      local_58[5] = (byte)(uVar7 / 100) | 0x30;
      local_58[6] = (char)(uVar7 / 10) + (char)((uVar7 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      local_58[7] = (char)(uVar7 / 10) * -10 + '0' + (char)uVar7;
      FString::AttachToOther(&local_40,&local_48);
      FString::operator+=(&local_40,local_58);
      __stream = fopen(local_40.Chars,"rb");
      if (__stream != (FILE *)0x0) {
        iVar1 = Q_filelength((FILE *)__stream);
        __n = (ulong)iVar1;
        piVar4 = (int *)operator_new__(__n);
        sVar5 = fread(piVar4,1,__n,__stream);
        if (sVar5 == __n) {
          iVar1 = 0;
          if ((*piVar4 == 1) && (iVar1 = (piVar4[3] - piVar4[2]) + 1, piVar4[3] < piVar4[2])) {
            iVar1 = 0;
          }
          if (iVar1 == 0) goto LAB_004fa372;
          TArray<unsigned_char_*,_unsigned_char_*>::Grow(local_38,1);
          uVar6 = (this->BuildTileFiles).Count;
          (this->BuildTileFiles).Array[uVar6] = (uchar *)piVar4;
          (this->BuildTileFiles).Count = uVar6 + 1;
          local_5c = local_5c + iVar1;
        }
        else {
LAB_004fa372:
          operator_delete__(piVar4);
        }
        fclose(__stream);
      }
      FString::~FString(&local_40);
      if (__stream == (FILE *)0x0) goto LAB_004fa3a2;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 1000);
    uVar7 = 1000;
LAB_004fa3a2:
    FString::~FString(&local_48);
  }
  if ((uint)uVar7 < 1000) {
    do {
      local_58[5] = (byte)(uVar7 / 100) | 0x30;
      local_58[6] = (char)(uVar7 / 10) + (char)((uVar7 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      local_58[7] = (char)uVar7 + (char)(uVar7 / 10) * -10 + '0';
      iVar1 = FWadCollection::CheckNumForFullName(&Wads,local_58,false,0);
      if (iVar1 < 0) {
        return local_5c;
      }
      iVar2 = FWadCollection::LumpLength(&Wads,iVar1);
      piVar4 = (int *)operator_new__((long)iVar2);
      FWadCollection::ReadLump(&Wads,iVar1,piVar4);
      iVar1 = 0;
      if ((*piVar4 == 1) && (iVar1 = (piVar4[3] - piVar4[2]) + 1, piVar4[3] < piVar4[2])) {
        iVar1 = 0;
      }
      if (iVar1 == 0) {
        operator_delete__(piVar4);
      }
      else {
        TArray<unsigned_char_*,_unsigned_char_*>::Grow(&this->BuildTileFiles,1);
        uVar6 = (this->BuildTileFiles).Count;
        (this->BuildTileFiles).Array[uVar6] = (uchar *)piVar4;
        (this->BuildTileFiles).Count = uVar6 + 1;
        local_5c = local_5c + iVar1;
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 1000);
  }
  return local_5c;
}

Assistant:

int FTextureManager::CountBuildTiles ()
{
	int numartfiles = 0;
	char artfile[] = "tilesXXX.art";
	int lumpnum;
	int numtiles;
	int totaltiles = 0;

	lumpnum = Wads.CheckNumForFullName ("blood.pal");
	if (lumpnum >= 0)
	{
		// Blood's tiles are external resources. (Why did they do it like that?)
		FString rffpath = Wads.GetWadFullName (Wads.GetLumpFile (lumpnum));
		int slashat = rffpath.LastIndexOf ('/');
		if (slashat >= 0)
		{
			rffpath.Truncate (slashat + 1);
		}
		else
		{
			rffpath += '/';
		}

		for (; numartfiles < 1000; numartfiles++)
		{
			artfile[5] = numartfiles / 100 + '0';
			artfile[6] = numartfiles / 10 % 10 + '0';
			artfile[7] = numartfiles % 10 + '0';

			FString artpath = rffpath;
			artpath += artfile;

			FILE *f = fopen (artpath, "rb");
			if (f == NULL)
			{
				break;
			}

			size_t len = Q_filelength (f);
			BYTE *art = new BYTE[len];
			if (fread (art, 1, len, f) != len || (numtiles = CountTiles(art)) == 0)
			{
				delete[] art;
			}
			else
			{
				BuildTileFiles.Push (art);
				totaltiles += numtiles;
			}
			fclose (f);
		}
	}

	for (; numartfiles < 1000; numartfiles++)
	{
		artfile[5] = numartfiles / 100 + '0';
		artfile[6] = numartfiles / 10 % 10 + '0';
		artfile[7] = numartfiles % 10 + '0';
		lumpnum = Wads.CheckNumForFullName (artfile);
		if (lumpnum < 0)
		{
			break;
		}

		BYTE *art = new BYTE[Wads.LumpLength (lumpnum)];
		Wads.ReadLump (lumpnum, art);

		if ((numtiles = CountTiles(art)) == 0)
		{
			delete[] art;
		}
		else
		{
			BuildTileFiles.Push (art);
			totaltiles += numtiles;
		}
	}
	return totaltiles;
}